

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaClearValidCtxt(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaIDCAugPtr pxVar1;
  xmlSchemaIDCMatcherPtr pxVar2;
  xmlSchemaPSVIIDCNodePtr pxVar3;
  xmlDictPtr pxVar4;
  xmlSchemaNodeInfoPtr ei;
  int i_2;
  int i_1;
  xmlSchemaPSVIIDCNodePtr item;
  int i;
  xmlSchemaIDCMatcherPtr_conflict tmp;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaIDCAugPtr_conflict next;
  xmlSchemaIDCAugPtr_conflict cur;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
    vctxt->flags = 0;
    vctxt->validationRoot = (xmlNodePtr)0x0;
    vctxt->doc = (xmlDocPtr)0x0;
    vctxt->reader = (xmlTextReaderPtr)0x0;
    vctxt->hasKeyrefs = 0;
    if (vctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(vctxt->value);
      vctxt->value = (xmlSchemaValPtr)0x0;
    }
    if (vctxt->aidcs != (xmlSchemaIDCAugPtr_conflict)0x0) {
      next = vctxt->aidcs;
      do {
        pxVar1 = next->next;
        (*xmlFree)(next);
        next = pxVar1;
      } while (pxVar1 != (xmlSchemaIDCAugPtr)0x0);
      vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
    }
    if (vctxt->idcMatcherCache != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
      tmp = vctxt->idcMatcherCache;
      while (tmp != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
        pxVar2 = tmp->nextCached;
        xmlSchemaIDCFreeMatcherList(tmp);
        tmp = pxVar2;
      }
      vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
    }
    if (vctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
      for (item._4_4_ = 0; item._4_4_ < vctxt->nbIdcNodes; item._4_4_ = item._4_4_ + 1) {
        pxVar3 = vctxt->idcNodes[item._4_4_];
        (*xmlFree)(pxVar3->keys);
        (*xmlFree)(pxVar3);
      }
      (*xmlFree)(vctxt->idcNodes);
      vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)0x0;
      vctxt->nbIdcNodes = 0;
      vctxt->sizeIdcNodes = 0;
    }
    if (vctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
      for (ei._4_4_ = 0; ei._4_4_ < vctxt->nbIdcKeys; ei._4_4_ = ei._4_4_ + 1) {
        xmlSchemaIDCFreeKey(vctxt->idcKeys[ei._4_4_]);
      }
      (*xmlFree)(vctxt->idcKeys);
      vctxt->idcKeys = (xmlSchemaPSVIIDCKeyPtr *)0x0;
      vctxt->nbIdcKeys = 0;
      vctxt->sizeIdcKeys = 0;
    }
    if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
      vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (vctxt->nbAttrInfos != 0) {
      xmlSchemaClearAttrInfos(vctxt);
    }
    if (vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) {
      for (ei._0_4_ = 0;
          ((int)ei < vctxt->sizeElemInfos &&
          (vctxt->elemInfos[(int)ei] != (xmlSchemaNodeInfoPtr)0x0)); ei._0_4_ = (int)ei + 1) {
        xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[(int)ei]);
      }
    }
    xmlSchemaItemListClear(vctxt->nodeQNames);
    xmlDictFree(vctxt->dict);
    pxVar4 = xmlDictCreate();
    vctxt->dict = pxVar4;
    if (vctxt->filename != (char *)0x0) {
      (*xmlFree)(vctxt->filename);
      vctxt->filename = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaClearValidCtxt(xmlSchemaValidCtxtPtr vctxt)
{
    if (vctxt == NULL)
        return;

    /*
    * TODO: Should we clear the flags?
    *   Might be problematic if one reuses the context
    *   and assumes that the options remain the same.
    */
    vctxt->flags = 0;
    vctxt->validationRoot = NULL;
    vctxt->doc = NULL;
#ifdef LIBXML_READER_ENABLED
    vctxt->reader = NULL;
#endif
    vctxt->hasKeyrefs = 0;

    if (vctxt->value != NULL) {
        xmlSchemaFreeValue(vctxt->value);
	vctxt->value = NULL;
    }
    /*
    * Augmented IDC information.
    */
    if (vctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr cur = vctxt->aidcs, next;
	do {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	} while (cur != NULL);
	vctxt->aidcs = NULL;
    }
    if (vctxt->idcMatcherCache != NULL) {
	xmlSchemaIDCMatcherPtr matcher = vctxt->idcMatcherCache, tmp;

	while (matcher) {
	    tmp = matcher;
	    matcher = matcher->nextCached;
	    xmlSchemaIDCFreeMatcherList(tmp);
	}
	vctxt->idcMatcherCache = NULL;
    }


    if (vctxt->idcNodes != NULL) {
	int i;
	xmlSchemaPSVIIDCNodePtr item;

	for (i = 0; i < vctxt->nbIdcNodes; i++) {
	    item = vctxt->idcNodes[i];
	    xmlFree(item->keys);
	    xmlFree(item);
	}
	xmlFree(vctxt->idcNodes);
	vctxt->idcNodes = NULL;
	vctxt->nbIdcNodes = 0;
	vctxt->sizeIdcNodes = 0;
    }

    if (vctxt->idcKeys != NULL) {
	int i;
	for (i = 0; i < vctxt->nbIdcKeys; i++)
	    xmlSchemaIDCFreeKey(vctxt->idcKeys[i]);
	xmlFree(vctxt->idcKeys);
	vctxt->idcKeys = NULL;
	vctxt->nbIdcKeys = 0;
	vctxt->sizeIdcKeys = 0;
    }

    /*
    * Note that we won't delete the XPath state pool here.
    */
    if (vctxt->xpathStates != NULL) {
	xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
	vctxt->xpathStates = NULL;
    }
    /*
    * Attribute info.
    */
    if (vctxt->nbAttrInfos != 0) {
	xmlSchemaClearAttrInfos(vctxt);
    }
    /*
    * Element info.
    */
    if (vctxt->elemInfos != NULL) {
	int i;
	xmlSchemaNodeInfoPtr ei;

	for (i = 0; i < vctxt->sizeElemInfos; i++) {
	    ei = vctxt->elemInfos[i];
	    if (ei == NULL)
		break;
	    xmlSchemaClearElemInfo(vctxt, ei);
	}
    }
    xmlSchemaItemListClear(vctxt->nodeQNames);
    /* Recreate the dict. */
    xmlDictFree(vctxt->dict);
    /*
    * TODO: Is is save to recreate it? Do we have a scenario
    * where the user provides the dict?
    */
    vctxt->dict = xmlDictCreate();

    if (vctxt->filename != NULL) {
        xmlFree(vctxt->filename);
	vctxt->filename = NULL;
    }
}